

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O3

void conv_fft(conv_object obj,double *inp1,double *inp2,double *oup)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double *inp;
  double *inp_00;
  fft_data *inp_01;
  fft_data *oup_00;
  fft_data *oup_01;
  double *oup_02;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  size_t __size;
  double dVar11;
  double dVar12;
  
  iVar3 = obj->clen;
  lVar10 = (long)iVar3;
  iVar4 = obj->ilen1;
  iVar5 = obj->ilen2;
  __size = lVar10 << 4;
  inp = (double *)malloc(__size);
  inp_00 = (double *)malloc(__size);
  inp_01 = (fft_data *)malloc(__size);
  oup_00 = (fft_data *)malloc(__size);
  oup_01 = (fft_data *)malloc(__size);
  oup_02 = (double *)malloc(__size);
  uVar9 = (iVar4 + iVar5) - 1;
  if (lVar10 < 1) {
    fft_r2c_exec(obj->fobj,inp,oup_00);
    fft_r2c_exec(obj->fobj,inp_00,oup_01);
  }
  else {
    lVar6 = 0;
    do {
      dVar11 = 0.0;
      dVar12 = 0.0;
      if (lVar6 < iVar4) {
        dVar12 = inp1[lVar6];
      }
      inp[lVar6] = dVar12;
      if (lVar6 < iVar5) {
        dVar11 = inp2[lVar6];
      }
      inp_00[lVar6] = dVar11;
      lVar6 = lVar6 + 1;
    } while (lVar10 != lVar6);
    fft_r2c_exec(obj->fobj,inp,oup_00);
    fft_r2c_exec(obj->fobj,inp_00,oup_01);
    if (0 < iVar3) {
      sVar7 = 0;
      do {
        dVar12 = *(double *)((long)&oup_00->re + sVar7);
        dVar11 = *(double *)((long)&oup_00->im + sVar7);
        dVar1 = *(double *)((long)&oup_01->re + sVar7);
        dVar2 = *(double *)((long)&oup_01->im + sVar7);
        *(double *)((long)&inp_01->re + sVar7) = dVar12 * dVar1 - dVar2 * dVar11;
        *(double *)((long)&inp_01->im + sVar7) = dVar11 * dVar1 + dVar12 * dVar2;
        sVar7 = sVar7 + 0x10;
      } while (__size != sVar7);
    }
  }
  fft_c2r_exec(obj->iobj,inp_01,oup_02);
  if (0 < (int)uVar9) {
    uVar8 = 0;
    do {
      oup[uVar8] = oup_02[uVar8] / (double)iVar3;
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
  free(inp);
  free(inp_00);
  free(inp_01);
  free(oup_00);
  free(oup_01);
  free(oup_02);
  return;
}

Assistant:

void conv_fft(const conv_object obj,fft_type *inp1,fft_type *inp2,fft_type *oup) {
	int i,N,L1,L2,ls;
	fft_type* a;
	fft_type* b;
	fft_data* c;
	fft_data* ao;
	fft_data* bo;
	fft_type* co;
	
	N = obj->clen;
	L1 = obj->ilen1;
	L2 = obj->ilen2;
	ls = L1 + L2 - 1;
	
	a = (fft_type*) malloc (sizeof(fft_data) * N);
	b = (fft_type*) malloc (sizeof(fft_data) * N);
	c = (fft_data*) malloc (sizeof(fft_data) * N);
	ao = (fft_data*) malloc (sizeof(fft_data) * N);
	bo = (fft_data*) malloc (sizeof(fft_data) * N);
	co = (fft_type*) malloc (sizeof(fft_data) * N);
	
	for (i = 0; i < N;i++) {
		if (i < L1) {
			a[i] = inp1[i];
		} else {
			a[i] = 0.0;
		}
		
		if (i < L2) {
			b[i] = inp2[i];
		} else {
			b[i] = 0.0;
		}
	
	}
	
	fft_r2c_exec(obj->fobj,a,ao);
	fft_r2c_exec(obj->fobj,b,bo);
	
	for (i = 0; i < N;i++) {
		c[i].re = ao[i].re * bo[i].re - ao[i].im * bo[i].im;
		c[i].im = ao[i].im * bo[i].re + ao[i].re * bo[i].im;
	}
	
	fft_c2r_exec(obj->iobj,c,co);
	
	for (i = 0; i < ls;i++) {
		oup[i] = co[i]/N;
	}
	
	free(a);
	free(b);
	free(c);
	free(ao);
	free(bo);
	free(co);
	
	
}